

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O3

void __thiscall
Test_TemplateModifiers_ManyUnknownModifiers::Test_TemplateModifiers_ManyUnknownModifiers
          (Test_TemplateModifiers_ManyUnknownModifiers *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(TemplateModifiers, ManyUnknownModifiers) {
  string tpl_str1 = "{{from_name:x-test=4}} sent you a message";
  const GOOGLE_NAMESPACE::Template* tpl1 = GOOGLE_NAMESPACE::Template::StringToTemplate(
      tpl_str1, GOOGLE_NAMESPACE::DO_NOT_STRIP);

  string tpl_str2 = "{{from_name:x-test=4}} sent you a message:";
  string expected_out = "me sent you a message:";
  // All those new unknown varnames should cause g_unknown_modifiers
  // to resize.  1111 is an arbitrary large number.
  for (int i = 0; i < 1111; i++) {
    tpl_str2.append("{{from_name:x-" + string(i, 't') + "=4}}");
    expected_out.append("me");
  }
  const GOOGLE_NAMESPACE::Template* tpl2 = GOOGLE_NAMESPACE::Template::StringToTemplate(
      tpl_str2, GOOGLE_NAMESPACE::DO_NOT_STRIP);

  // Even after the resizing, the references to the unknown
  // modifiers in tpl1 and tpl2 should still be valid.
  GOOGLE_NAMESPACE::TemplateDictionary dict("test");
  dict.SetValue("from_name", "me");
  string out;

  out.clear();
  tpl1->Expand(&out, &dict);
  EXPECT_STREQ("me sent you a message", out.c_str());
  delete tpl1;

  out.clear();
  tpl2->Expand(&out, &dict);
  EXPECT_STREQ(expected_out.c_str(), out.c_str());
  delete tpl2;
}